

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Set_data64(int g_a,int ndim,int64_t *dims,int type)

{
  long in_RDX;
  int in_ESI;
  int i;
  Integer _ga_dims [7];
  Integer ttype;
  Integer nndim;
  Integer aa;
  int local_6c;
  Integer in_stack_ffffffffffffff98;
  Integer *in_stack_ffffffffffffffa0;
  Integer in_stack_ffffffffffffffa8;
  Integer in_stack_ffffffffffffffb0;
  
  for (local_6c = 0; local_6c < in_ESI; local_6c = local_6c + 1) {
    *(undefined8 *)(&stack0xffffffffffffff98 + (long)((in_ESI - local_6c) + -1) * 8) =
         *(undefined8 *)(in_RDX + (long)local_6c * 8);
  }
  pnga_set_data(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                in_stack_ffffffffffffff98);
  return;
}

Assistant:

void NGA_Set_data64(int g_a, int ndim, int64_t dims[], int type)
{
    Integer aa, nndim, ttype;
    Integer _ga_dims[MAXDIM];
    COPYC2F(dims,_ga_dims, ndim);
    aa = (Integer)g_a;
    nndim = (Integer)ndim;
    ttype = (Integer)type;
    wnga_set_data(aa, nndim, _ga_dims, ttype);
}